

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

Vec_Int_t * Nwk_ManLutMerge(Nwk_Man_t *pNtk,void *pParsInit)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  abctime aVar3;
  void *pvVar4;
  Nwk_Grf_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Ptr_t *p_03;
  Nwk_Obj_t *pLut;
  abctime aVar5;
  int iVar6;
  int iVar7;
  uint i;
  int i_00;
  uint uVar8;
  int iVar9;
  uint local_78;
  
  aVar3 = Abc_Clock();
  iVar7 = 0;
  for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(pNtk->vObjs,iVar6);
    if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x20) & 7) == 3)) {
      iVar7 = iVar7 + (uint)(*(int *)((long)pvVar4 + 0x3c) <= *pParsInit);
    }
  }
  p = Nwk_ManGraphAlloc(iVar7);
  p_00 = Vec_PtrAlloc(iVar7);
  p_01 = Vec_PtrAlloc(iVar7);
  p_02 = Vec_PtrAlloc(iVar7);
  p_03 = Vec_PtrAlloc(iVar7);
  local_78 = 0;
  for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
    pLut = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar6);
    if (((pLut != (Nwk_Obj_t *)0x0) && ((*(uint *)&pLut->field_0x20 & 7) == 3)) &&
       (pLut->nFanins <= *pParsInit)) {
      Nwk_ManCollectOverlapCands(pLut,p_02,(Nwk_LMPars_t *)pParsInit);
      if (*(int *)((long)pParsInit + 0x14) != 0) {
        Nwk_ManCollectNonOverlapCands(pLut,p_00,p_01,p_03,(Nwk_LMPars_t *)pParsInit);
      }
      uVar1 = p_02->nSize;
      iVar7 = p_03->nSize;
      if (uVar1 != 0 || iVar7 != 0) {
        uVar8 = 0;
        i = 0;
        if (0 < (int)uVar1) {
          uVar8 = uVar1;
          i = 0;
        }
        for (; uVar8 != i; i = i + 1) {
          pvVar4 = Vec_PtrEntry(p_02,i);
          Nwk_ManGraphHashEdge(p,pLut->Id,*(int *)((long)pvVar4 + 0x24));
        }
        i_00 = 0;
        iVar9 = 0;
        if (0 < iVar7) {
          iVar9 = iVar7;
        }
        for (; iVar9 != i_00; i_00 = i_00 + 1) {
          pvVar4 = Vec_PtrEntry(p_03,i_00);
          Nwk_ManGraphHashEdge(p,pLut->Id,*(int *)((long)pvVar4 + 0x24));
        }
        local_78 = local_78 + uVar1 + iVar7;
        if (*(int *)((long)pParsInit + 0x1c) != 0) {
          printf("Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
                 (ulong)(uint)pLut->Id,(ulong)(uint)pLut->nFanins,(ulong)(uint)pLut->nFanins,
                 (ulong)uVar1);
        }
      }
    }
  }
  Vec_PtrFree(p_00);
  Vec_PtrFree(p_01);
  Vec_PtrFree(p_02);
  Vec_PtrFree(p_03);
  if (*(int *)((long)pParsInit + 0x20) != 0) {
    iVar6 = 0x7b3bb9;
    printf("Mergable LUTs = %6d. Total cands = %6d. ",(ulong)(uint)p->nVertsMax,(ulong)local_78);
    Abc_Print(iVar6,"%s =","Deriving graph");
    aVar5 = Abc_Clock();
    Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
  }
  aVar3 = Abc_Clock();
  Nwk_ManGraphSolve(p);
  if (*(int *)((long)pParsInit + 0x20) != 0) {
    iVar6 = 0x7b3bf1;
    printf("GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ",(ulong)(uint)p->nVerts,
           (ulong)(uint)p->nEdges,(long)p->vPairs->nSize / 2 & 0xffffffff);
    Abc_Print(iVar6,"%s =","Solving");
    aVar5 = Abc_Clock();
    Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
    Nwk_ManGraphReportMemoryUsage(p);
  }
  pVVar2 = p->vPairs;
  p->vPairs = (Vec_Int_t *)0x0;
  Nwk_ManGraphFree(p);
  return pVVar2;
}

Assistant:

Vec_Int_t * Nwk_ManLutMerge( Nwk_Man_t * pNtk, void * pParsInit )
{
    Nwk_LMPars_t * pPars = (Nwk_LMPars_t *)pParsInit;
    Nwk_Grf_t * p;
    Vec_Int_t * vResult;
    Vec_Ptr_t * vStart, * vNext, * vCands1, * vCands2;
    Nwk_Obj_t * pLut, * pCand;
    int i, k, nVertsMax, nCands;
    abctime clk = Abc_Clock();
    // count the number of vertices
    nVertsMax = 0;
    Nwk_ManForEachNode( pNtk, pLut, i )
        nVertsMax += (int)(Nwk_ObjFaninNum(pLut) <= pPars->nMaxLutSize);
    p = Nwk_ManGraphAlloc( nVertsMax );
    // create graph
    vStart  = Vec_PtrAlloc( 1000 );
    vNext   = Vec_PtrAlloc( 1000 );
    vCands1 = Vec_PtrAlloc( 1000 );
    vCands2 = Vec_PtrAlloc( 1000 );
    nCands  = 0;
    Nwk_ManForEachNode( pNtk, pLut, i )
    {
        if ( Nwk_ObjFaninNum(pLut) > pPars->nMaxLutSize )
            continue;
        Nwk_ManCollectOverlapCands( pLut, vCands1, pPars );
        if ( pPars->fUseDiffSupp )
            Nwk_ManCollectNonOverlapCands( pLut, vStart, vNext, vCands2, pPars );
        if ( Vec_PtrSize(vCands1) == 0 && Vec_PtrSize(vCands2) == 0 )
            continue;
        nCands += Vec_PtrSize(vCands1) + Vec_PtrSize(vCands2);
        // save candidates
        Vec_PtrForEachEntry( Nwk_Obj_t *, vCands1, pCand, k )
            Nwk_ManGraphHashEdge( p, Nwk_ObjId(pLut), Nwk_ObjId(pCand) );
        Vec_PtrForEachEntry( Nwk_Obj_t *, vCands2, pCand, k )
            Nwk_ManGraphHashEdge( p, Nwk_ObjId(pLut), Nwk_ObjId(pCand) );
        // print statistics about this node
        if ( pPars->fVeryVerbose )
        printf( "Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
            Nwk_ObjId(pLut), Nwk_ObjFaninNum(pLut), Nwk_ObjFaninNum(pLut), 
            Vec_PtrSize(vCands1), Vec_PtrSize(vCands2) );
    }
    Vec_PtrFree( vStart );
    Vec_PtrFree( vNext );
    Vec_PtrFree( vCands1 );
    Vec_PtrFree( vCands2 );
    if ( pPars->fVerbose )
    {
        printf( "Mergable LUTs = %6d. Total cands = %6d. ", p->nVertsMax, nCands );
        ABC_PRT( "Deriving graph", Abc_Clock() - clk );
    }
    // solve the graph problem
    clk = Abc_Clock();
    Nwk_ManGraphSolve( p );
    if ( pPars->fVerbose )
    {
        printf( "GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ", 
            p->nVerts, p->nEdges, Vec_IntSize(p->vPairs)/2 );
        ABC_PRT( "Solving", Abc_Clock() - clk );
        Nwk_ManGraphReportMemoryUsage( p );
    }
    vResult = p->vPairs; p->vPairs = NULL;
/*
    for ( i = 0; i < vResult->nSize; i += 2 )
        printf( "(%d,%d) ", vResult->pArray[i], vResult->pArray[i+1] );
    printf( "\n" );
*/
    Nwk_ManGraphFree( p );
    return vResult;
}